

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t * fmt::v5::internal::
          parse_width<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  uint width;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *in_RDX;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_RSI;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_RDI;
  char *in_stack_ffffffffffffffb8;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_ffffffffffffffc0;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *psVar1;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
  *in_stack_ffffffffffffffc8;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  in_stack_ffffffffffffffd8;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *end_00;
  wchar_t *in_stack_fffffffffffffff8;
  
  if ((*(wchar_t *)&(in_RDI->super_specs_setter<wchar_t>).specs_ < L'0') ||
     (L'9' < *(wchar_t *)&(in_RDI->super_specs_setter<wchar_t>).specs_)) {
    if (*(wchar_t *)&(in_RDI->super_specs_setter<wchar_t>).specs_ == L'{') {
      psVar1 = (specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                *)((long)&(in_RDI->super_specs_setter<wchar_t>).specs_ + 4);
      in_RDI = psVar1;
      if (psVar1 != in_RSI) {
        end_00 = psVar1;
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
        ::width_adapter((width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                         *)&stack0xffffffffffffffd8,in_RDX);
        in_RDI = (specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  *)parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                              (in_stack_fffffffffffffff8,(wchar_t *)end_00,
                               (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                                *)in_RSI);
        in_stack_ffffffffffffffc0 = psVar1;
      }
      if ((in_RDI == in_RSI) || (*(wchar_t *)&(in_RDI->super_specs_setter<wchar_t>).specs_ != L'}'))
      {
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ::on_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        in_RDI = (specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                  *)((long)&(in_RDI->super_specs_setter<wchar_t>).specs_ + 4);
      }
    }
  }
  else {
    width = parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                      ((wchar_t **)in_stack_ffffffffffffffd8.handler,(wchar_t *)in_RDX,
                       in_stack_ffffffffffffffc8);
    specs_setter<wchar_t>::on_width((specs_setter<wchar_t> *)in_RDX,width);
  }
  return (wchar_t *)in_RDI;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}